

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

string * __thiscall
iDynTree::KinDynComputations::getDescriptionOfDegreesOfFreedom_abi_cxx11_(KinDynComputations *this)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  KinDynComputations *this_00;
  string *in_RDI;
  uint dof;
  stringstream ss;
  ostream *in_stack_fffffffffffffdf0;
  int dof_index;
  string local_1d0 [52];
  uint local_19c;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_19c = 0;
  while( true ) {
    uVar1 = local_19c;
    dof_index = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
    uVar2 = getNrOfDegreesOfFreedom((KinDynComputations *)0x1c8438);
    if (uVar2 <= uVar1) break;
    poVar3 = std::operator<<(local_188,"DOF Index: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_19c);
    this_00 = (KinDynComputations *)std::operator<<(poVar3," Name: ");
    getDescriptionOfDegreeOfFreedom_abi_cxx11_(this_00,dof_index);
    in_stack_fffffffffffffdf0 = std::operator<<((ostream *)this_00,local_1d0);
    std::ostream::operator<<(in_stack_fffffffffffffdf0,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d0);
    local_19c = local_19c + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string KinDynComputations::getDescriptionOfDegreesOfFreedom() const
{
    std::stringstream ss;

    for(unsigned int dof = 0; dof < this->getNrOfDegreesOfFreedom(); dof++ )
    {
        ss << "DOF Index: " << dof << " Name: " <<  this->getDescriptionOfDegreeOfFreedom(dof) << std::endl;
    }

    return ss.str();
}